

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

void close_secondarysocket(Curl_easy *data,connectdata *conn)

{
  if (conn->sock[1] != -1) {
    Curl_closesocket(data,conn,conn->sock[1]);
    conn->sock[1] = -1;
  }
  (conn->bits).tcpconnect[1] = false;
  (conn->bits).proxy_ssl_connected[1] = false;
  return;
}

Assistant:

static void close_secondarysocket(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET]) {
    Curl_closesocket(data, conn, conn->sock[SECONDARYSOCKET]);
    conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
  }
  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
#ifndef CURL_DISABLE_PROXY
  conn->bits.proxy_ssl_connected[SECONDARYSOCKET] = FALSE;
#endif
}